

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall
cmGeneratorTarget::IsLinkInterfaceDependentStringProperty
          (cmGeneratorTarget *this,string *p,string *config)

{
  TargetType TVar1;
  CompatibleInterfacesBase *pCVar2;
  size_type sVar3;
  string *config_local;
  string *p_local;
  cmGeneratorTarget *this_local;
  
  TVar1 = GetType(this);
  if ((TVar1 != OBJECT_LIBRARY) && (TVar1 = GetType(this), TVar1 != INTERFACE_LIBRARY)) {
    pCVar2 = GetCompatibleInterfaces(this,config);
    sVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&pCVar2->PropsString,p);
    return sVar3 != 0;
  }
  return false;
}

Assistant:

bool cmGeneratorTarget::IsLinkInterfaceDependentStringProperty(
  const std::string& p, const std::string& config) const
{
  if (this->GetType() == cmStateEnums::OBJECT_LIBRARY ||
      this->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    return false;
  }
  return this->GetCompatibleInterfaces(config).PropsString.count(p) > 0;
}